

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

string __thiscall
mjs::anon_unknown_35::do_get_replacement_string
          (anon_unknown_35 *this,string *str,object_ptr *match,value *replace_value)

{
  value_type vVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  string *psVar6;
  size_type sVar7;
  size_type sVar8;
  const_reference pvVar9;
  wchar_t *pwVar10;
  wostream *pwVar11;
  object *poVar12;
  gc_heap *pgVar13;
  uint32_t index;
  uint32_t index_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar14;
  wstring_view wVar15;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar16;
  undefined1 auVar17 [16];
  string sVar18;
  value local_8c0;
  value local_898;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_870;
  value_type local_860;
  wstring local_838;
  undefined1 local_818 [16];
  value_type local_808;
  uint local_7dc;
  undefined1 local_7d8 [4];
  uint32_t i_1;
  value local_7c8;
  uint local_79c;
  undefined1 local_798 [4];
  uint32_t m;
  value_type local_788;
  undefined1 local_760 [8];
  vector<mjs::value,_std::allocator<mjs::value>_> args;
  wstring local_738 [32];
  wstring_view local_718;
  wostringstream local_708 [8];
  wostringstream _woss_2;
  wstring_view local_590;
  wstring local_580;
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  value cval;
  wstring_view local_508;
  wostringstream local_4f8 [8];
  wostringstream _woss_1;
  uint local_37c;
  undefined1 local_378 [4];
  uint32_t idx;
  value local_368;
  wstring_view local_340;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_330;
  value local_320;
  wstring_view local_2f8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_2e8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_2d8;
  value local_2c8;
  wstring_view local_2a0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_290;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_280;
  value local_270;
  wstring_view local_248;
  wstring local_238 [32];
  wstring_view local_218;
  wostringstream local_208 [8];
  wostringstream _woss;
  uint local_8c;
  uint32_t l;
  uint32_t i;
  wstring_view r;
  wstring res;
  wstring_view local_48;
  undefined1 local_38 [8];
  string rep_str;
  value *replace_value_local;
  object_ptr *match_local;
  string *str_local;
  
  rep_str.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = replace_value;
  vVar1 = value::type(replace_value);
  if (vVar1 == string) {
    psVar6 = value::string_value((value *)rep_str.super_gc_heap_ptr<mjs::gc_string>.
                                          super_gc_heap_ptr_untyped._8_8_);
    string::string((string *)local_38,psVar6);
    local_48 = string::view((string *)local_38);
    sVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::find_first_of
                      (&local_48,L'$',0);
    if (sVar7 == 0xffffffffffffffff) {
      string::string((string *)this,(string *)local_38);
    }
    else {
      std::__cxx11::wstring::wstring((wstring *)&r._M_str);
      wVar15 = string::view((string *)local_38);
      r._M_len = (size_t)wVar15._M_str;
      _l = wVar15._M_len;
      local_8c = 0;
      sVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l);
      uVar2 = (uint)sVar8;
      while (local_8c < uVar2) {
        pvVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l,
                            (ulong)local_8c);
        if (*pvVar9 == 0x24) {
          uVar3 = local_8c + 1;
          if (uVar2 <= uVar3) {
            std::__cxx11::wostringstream::wostringstream(local_208);
            pwVar11 = std::operator<<((wostream *)local_208,"Not implemented: ");
            std::operator<<(pwVar11,"$ at end of string");
            std::__cxx11::wostringstream::str();
            local_218 = (wstring_view)
                        std::__cxx11::wstring::operator_cast_to_basic_string_view(local_238);
            throw_runtime_error(&local_218,
                                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                                ,0x12a);
          }
          pvVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                             ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l,
                              (ulong)uVar3);
          if (*pvVar9 == 0x24) {
            std::__cxx11::wstring::operator+=((wstring *)&r._M_str,L'$');
            local_8c = local_8c + 2;
          }
          else {
            pvVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                               ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l,
                                (ulong)uVar3);
            if (*pvVar9 == 0x26) {
              poVar12 = gc_heap_ptr<mjs::object>::operator->(match);
              std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                        (&local_280,L"0");
              (**poVar12->_vptr_object)(&local_270,poVar12,&local_280);
              psVar6 = value::string_value(&local_270);
              wVar15 = string::view(psVar6);
              local_248 = wVar15;
              std::__cxx11::wstring::operator+=((wstring *)&r._M_str,&local_248);
              value::~value(&local_270);
              local_8c = local_8c + 2;
            }
            else {
              pvVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                                 ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l,
                                  (ulong)uVar3);
              if (*pvVar9 == 0x60) {
                local_8c = local_8c + 2;
                wVar15 = string::view(str);
                local_2a0 = wVar15;
                poVar12 = gc_heap_ptr<mjs::object>::operator->(match);
                std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                          (&local_2d8,L"index");
                (**poVar12->_vptr_object)(&local_2c8,poVar12,&local_2d8);
                uVar4 = to_uint32(&local_2c8);
                bVar16 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                                   (&local_2a0,0,(ulong)uVar4);
                local_290 = bVar16;
                std::__cxx11::wstring::operator+=((wstring *)&r._M_str,&local_290);
                value::~value(&local_2c8);
              }
              else {
                pvVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                                   ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l,
                                    (ulong)uVar3);
                if (*pvVar9 == 0x27) {
                  local_8c = local_8c + 2;
                  wVar15 = string::view(str);
                  local_2f8 = wVar15;
                  poVar12 = gc_heap_ptr<mjs::object>::operator->(match);
                  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                            (&local_330,L"index");
                  (**poVar12->_vptr_object)(&local_320,poVar12,&local_330);
                  uVar4 = to_uint32(&local_320);
                  poVar12 = gc_heap_ptr<mjs::object>::operator->(match);
                  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_378,
                             L"0");
                  (**poVar12->_vptr_object)
                            (&local_368,poVar12,
                             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_378);
                  psVar6 = value::string_value(&local_368);
                  wVar15 = string::view(psVar6);
                  local_340 = wVar15;
                  sVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                                    (&local_340);
                  bVar16 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                                     (&local_2f8,uVar4 + sVar8,0xffffffffffffffff);
                  local_2e8 = bVar16;
                  std::__cxx11::wstring::operator+=((wstring *)&r._M_str,&local_2e8);
                  value::~value(&local_368);
                  value::~value(&local_320);
                }
                else {
                  pvVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l,
                                      (ulong)uVar3);
                  iVar5 = isdigit(*pvVar9);
                  if (iVar5 == 0) {
                    std::__cxx11::wostringstream::wostringstream(local_708);
                    pwVar11 = std::operator<<((wostream *)local_708,"Not implemented: ");
                    std::operator<<(pwVar11,"Invalid replacement characters");
                    std::__cxx11::wostringstream::str();
                    local_718 = (wstring_view)
                                std::__cxx11::wstring::operator_cast_to_basic_string_view(local_738)
                    ;
                    throw_runtime_error(&local_718,
                                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                                        ,0x14c);
                  }
                  pvVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l,
                                      (ulong)uVar3);
                  local_37c = *pvVar9 - 0x30;
                  uVar3 = local_8c + 2;
                  if (uVar3 < uVar2) {
                    pvVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l
                                        ,(ulong)uVar3);
                    iVar5 = isdigit(*pvVar9);
                    if (iVar5 != 0) {
                      pvVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::
                               operator[]((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                                          &l,(ulong)uVar3);
                      local_37c = (local_37c * 10 + *pvVar9) - 0x30;
                      uVar3 = local_8c + 3;
                    }
                  }
                  local_8c = uVar3;
                  if (local_37c == 0) {
                    std::__cxx11::wostringstream::wostringstream(local_4f8);
                    pwVar11 = std::operator<<((wostream *)local_4f8,"Not implemented: ");
                    std::operator<<(pwVar11,"$0 used");
                    std::__cxx11::wostringstream::str();
                    local_508 = (wstring_view)
                                std::__cxx11::wstring::operator_cast_to_basic_string_view
                                          ((wstring *)
                                           &cval.field_1.r_.property_name_.
                                            super_gc_heap_ptr<mjs::gc_string>.
                                            super_gc_heap_ptr_untyped.pos_);
                    throw_runtime_error(&local_508,
                                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                                        ,0x143);
                  }
                  poVar12 = gc_heap_ptr<mjs::object>::operator->(match);
                  index_string_abi_cxx11_(&local_580,(mjs *)(ulong)local_37c,index);
                  auVar17 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                                      ((wstring *)&local_580);
                  local_560 = auVar17;
                  (**poVar12->_vptr_object)(local_550,poVar12,local_560);
                  std::__cxx11::wstring::~wstring((wstring *)&local_580);
                  vVar1 = value::type((value *)local_550);
                  if (vVar1 == string) {
                    psVar6 = value::string_value((value *)local_550);
                    wVar15 = string::view(psVar6);
                    local_590 = wVar15;
                    std::__cxx11::wstring::operator+=((wstring *)&r._M_str,&local_590);
                  }
                  value::~value((value *)local_550);
                }
              }
            }
          }
        }
        else {
          pwVar10 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l,
                               (ulong)local_8c);
          std::__cxx11::wstring::operator+=((wstring *)&r._M_str,*pwVar10);
          local_8c = local_8c + 1;
        }
      }
      pgVar13 = gc_heap_ptr_untyped::heap(&match->super_gc_heap_ptr_untyped);
      args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&r._M_str);
      string::string((string *)this,pgVar13,
                     (wstring_view *)
                     &args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::wstring::~wstring((wstring *)&r._M_str);
    }
    string::~string((string *)local_38);
    uVar14 = extraout_RDX;
  }
  else {
    std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_760);
    poVar12 = gc_heap_ptr<mjs::object>::operator->(match);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_798,L"0");
    (**poVar12->_vptr_object)
              (&local_788,poVar12,
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_798);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::push_back
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_760,&local_788);
    value::~value(&local_788);
    poVar12 = gc_heap_ptr<mjs::object>::operator->(match);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_7d8,L"length");
    (**poVar12->_vptr_object)
              (&local_7c8,poVar12,
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_7d8);
    uVar4 = to_uint32(&local_7c8);
    value::~value(&local_7c8);
    local_79c = uVar4;
    for (local_7dc = 1; local_7dc < local_79c; local_7dc = local_7dc + 1) {
      poVar12 = gc_heap_ptr<mjs::object>::operator->(match);
      index_string_abi_cxx11_(&local_838,(mjs *)(ulong)local_7dc,index_00);
      auVar17 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_838);
      local_818 = auVar17;
      (**poVar12->_vptr_object)(&local_808,poVar12,local_818);
      std::vector<mjs::value,_std::allocator<mjs::value>_>::push_back
                ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_760,&local_808);
      value::~value(&local_808);
      std::__cxx11::wstring::~wstring((wstring *)&local_838);
    }
    poVar12 = gc_heap_ptr<mjs::object>::operator->(match);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_870,L"index");
    (**poVar12->_vptr_object)(&local_860,poVar12,&local_870);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::push_back
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_760,&local_860);
    value::~value(&local_860);
    value::value(&local_898,str);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::push_back
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_760,&local_898);
    value::~value(&local_898);
    pgVar13 = gc_heap_ptr_untyped::heap(&match->super_gc_heap_ptr_untyped);
    call_function(&local_8c0,
                  (value *)rep_str.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_
                  ,(value *)value::undefined,
                  (vector<mjs::value,_std::allocator<mjs::value>_> *)local_760);
    to_string((mjs *)this,pgVar13,&local_8c0);
    value::~value(&local_8c0);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_760);
    uVar14 = extraout_RDX_00;
  }
  sVar18.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar14;
  sVar18.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar18.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string do_get_replacement_string(const string& str, const object_ptr& match, const value& replace_value) {
    if (replace_value.type() == value_type::string) {
        const auto rep_str = replace_value.string_value();
        if (rep_str.view().find_first_of(L'$') == std::wstring_view::npos) {
            // Fast and easy
            return rep_str;
        }

        std::wstring res;
        const auto r = rep_str.view();
        for (uint32_t i = 0, l = static_cast<uint32_t>(r.length()); i < l;) {
            if (r[i] != L'$') {
                res += r[i];
                ++i;
                continue;
            }
            ++i;
            if (i >= l) {
                NOT_IMPLEMENTED("$ at end of string");
            }
            if (r[i] == '$') {
                res += L'$';
                ++i;
            } else if (r[i] == L'&') {
                // The matched substring
                res += match->get(L"0").string_value().view();
                ++i;
            } else if (r[i] == L'`') {
                //The portion of string that precedes the matched substring.
                ++i;
                res += str.view().substr(0, to_uint32(match->get(L"index")));
            } else if (r[i] == L'\'') {
                //The portion of string that follows the matched substring.
                ++i;
                res += str.view().substr(to_uint32(match->get(L"index")) + match->get(L"0").string_value().view().length());
            } else if (isdigit(r[i])) {
                uint32_t idx = r[i]-L'0';
                ++i;
                if (i < l && isdigit(r[i])) {
                    idx = idx*10+r[i]-L'0';
                    ++i;
                }
                if (!idx) {
                    NOT_IMPLEMENTED("$0 used");
                }
                auto cval = match->get(index_string(idx));
                if (cval.type() == value_type::string) {
                    res += cval.string_value().view();
                } else {
                    // Using empty string
                }
            } else {
                NOT_IMPLEMENTED("Invalid replacement characters");
            }
        }

        return string{match.heap(), res};
    }

    std::vector<value> args;
    args.push_back(match->get(L"0"));
    const auto m = to_uint32(match->get(L"length"));
    for (uint32_t i = 1; i < m; ++i) {
        args.push_back(match->get(index_string(i)));
    }
    args.push_back(match->get(L"index"));
    args.push_back(value{str});

    return to_string(match.heap(), call_function(replace_value, value::undefined, args));
}